

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  Label LVar5;
  int iVar6;
  ulong uVar7;
  Descriptor *pDVar8;
  _anonymous_namespace_ *this_00;
  ClassNameResolver *pCVar9;
  string_view local_168;
  string_view local_158;
  string_view local_148;
  string local_138;
  string_view local_118;
  string local_108;
  string_view local_e8;
  string_view local_d8 [2];
  string local_b8;
  string_view local_98;
  FieldGeneratorInfo *local_88;
  FieldGeneratorInfo *info_1;
  FieldDescriptor *field_1;
  undefined1 auStack_70 [4];
  int i_1;
  FieldGeneratorInfo *local_60;
  FieldGeneratorInfo *info;
  FieldDescriptor *field;
  undefined1 auStack_48 [4];
  int i;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"private byte memoizedIsInitialized = -1;\n");
  io::Printer::Print<>(printer,local_28);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"@java.lang.Override\npublic final boolean isInitialized() {\n");
  io::Printer::Print<>(pPVar1,local_38);
  io::Printer::Indent(local_18);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,
             "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
            );
  io::Printer::Print<>(pPVar1,_auStack_48);
  for (field._4_4_ = 0; iVar6 = field._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar3;
      field._4_4_ = field._4_4_ + 1) {
    info = (FieldGeneratorInfo *)
           Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    local_60 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
    uVar7 = google::protobuf::FieldDescriptor::is_required();
    pPVar1 = local_18;
    if ((uVar7 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_70,
                 "if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n");
      io::Printer::Print<char[5],std::__cxx11::string>
                (pPVar1,_auStack_70,(char (*) [5])0x6b980f,&local_60->capitalized_name);
    }
  }
  for (field_1._4_4_ = 0; iVar6 = field_1._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar3;
      field_1._4_4_ = field_1._4_4_ + 1) {
    info_1 = (FieldGeneratorInfo *)
             Descriptor::field((this->super_MessageGenerator).descriptor_,field_1._4_4_);
    local_88 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info_1);
    JVar4 = GetJavaType((FieldDescriptor *)info_1);
    if (JVar4 == JAVATYPE_MESSAGE) {
      pDVar8 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
      bVar2 = HasRequiredFields(pDVar8);
      if (bVar2) {
        LVar5 = FieldDescriptor::label((FieldDescriptor *)info_1);
        pPVar1 = local_18;
        pCVar9 = (ClassNameResolver *)(ulong)LVar5;
        if (LVar5 == LABEL_OPTIONAL) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (local_d8,
                     "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                    );
          io::Printer::Print<char[5],std::__cxx11::string>
                    (pPVar1,local_d8[0],(char (*) [5])0x6b980f,&local_88->capitalized_name);
        }
        else if (LVar5 == LABEL_REQUIRED) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_98,
                     "if (!get$name$().isInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
                    );
          pCVar9 = this->name_resolver_;
          pDVar8 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
          ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                    (&local_b8,pCVar9,pDVar8);
          io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                    (pPVar1,local_98,(char (*) [5])0x61fb6b,&local_b8,(char (*) [5])0x6b980f,
                     &local_88->capitalized_name);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        else if (LVar5 == LABEL_REPEATED) {
          pDVar8 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
          bVar2 = IsMapEntry(pDVar8);
          pPVar1 = local_18;
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e8,
                       "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                      );
            this_00 = (_anonymous_namespace_ *)google::protobuf::FieldDescriptor::message_type();
            (anonymous_namespace)::MapValueImmutableClassdName_abi_cxx11_
                      (&local_108,this_00,(Descriptor *)this->name_resolver_,pCVar9);
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (pPVar1,local_e8,(char (*) [5])0x61fb6b,&local_108,(char (*) [5])0x6b980f,
                       &local_88->capitalized_name);
            std::__cxx11::string::~string((string *)&local_108);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_118,
                       "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
                      );
            pCVar9 = this->name_resolver_;
            pDVar8 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      (&local_138,pCVar9,pDVar8);
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (pPVar1,local_118,(char (*) [5])0x61fb6b,&local_138,(char (*) [5])0x6b980f,
                       &local_88->capitalized_name);
            std::__cxx11::string::~string((string *)&local_138);
          }
        }
      }
    }
  }
  iVar6 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  pPVar1 = local_18;
  if (0 < iVar6) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_148,
               "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
              );
    io::Printer::Print<>(pPVar1,local_148);
  }
  google::protobuf::io::Printer::Outdent();
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,"  memoizedIsInitialized = 1;\n");
  io::Printer::Print<>(pPVar1,local_158);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,"  return true;\n}\n\n");
  io::Printer::Print<>(pPVar1,local_168);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO:  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
              "if (!get$name$().isInitialized()) {\n"
              "  memoizedIsInitialized = 0;\n"
              "  return false;\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
              "if (has$name$()) {\n"
              "  if (!get$name$().isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
                "for ($type$ item : get$name$Map().values()) {\n"
                "  if (!item.isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                MapValueImmutableClassdName(field->message_type(),
                                            name_resolver_),
                "name", info->capitalized_name);
          } else {
            printer->Print(
                "for (int i = 0; i < get$name$Count(); i++) {\n"
                "  if (!get$name$(i).isInitialized()) {\n"
                "    memoizedIsInitialized = 0;\n"
                "    return false;\n"
                "  }\n"
                "}\n",
                "type",
                name_resolver_->GetImmutableClassName(field->message_type()),
                "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}